

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O3

bool __thiscall
GF2::MI<45ul,GF2::MOGrlex<45ul>>::Find<45ul,GF2::MOLex<45ul>>
          (MI<45ul,GF2::MOGrlex<45ul>> *this,MP<45UL,_GF2::MOLex<45UL>_> *polyRight,iterator *pos)

{
  undefined8 uVar1;
  _List_node_base *p_Var2;
  int iVar3;
  _List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> _Var4;
  _List_node_base *p_Var5;
  bool bVar6;
  MP<45UL,_GF2::MOGrlex<45UL>_> poly;
  MP<45UL,_GF2::MOGrlex<45UL>_> local_48;
  
  local_48.super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
  super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_48;
  local_48.super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
  super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48.super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
  super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node._M_size = 0;
  uVar1 = *(undefined8 *)this;
  std::__cxx11::list<GF2::MM<45ul>,std::allocator<GF2::MM<45ul>>>::
  _M_assign_dispatch<std::_List_const_iterator<GF2::MM<45ul>>>
            ((list<GF2::MM<45ul>,std::allocator<GF2::MM<45ul>>> *)&local_48,
             (polyRight->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>).
             super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
             super__List_node_base._M_next,polyRight);
  MP<45UL,_GF2::MOGrlex<45UL>_>::Normalize(&local_48);
  _Var4 = std::
          __lower_bound<std::_List_iterator<GF2::MP<45ul,GF2::MOGrlex<45ul>>>,GF2::MP<45ul,GF2::MOGrlex<45ul>>,__gnu_cxx::__ops::_Iter_less_val>
                    (uVar1,this,&local_48);
  pos->_M_node = _Var4._M_node;
  if ((_Var4._M_node == (_List_node_base *)this) ||
     (_Var4._M_node[2]._M_next !=
      (_List_node_base *)
      local_48.super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
      super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node._M_size)) {
    bVar6 = false;
  }
  else {
    iVar3 = MP<45UL,_GF2::MOGrlex<45UL>_>::Compare
                      ((MP<45UL,_GF2::MOGrlex<45UL>_> *)(_Var4._M_node + 1),&local_48);
    bVar6 = iVar3 == 0;
  }
  p_Var5 = local_48.super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
           super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (local_48.super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
      super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_48) {
    do {
      p_Var2 = p_Var5->_M_next;
      operator_delete(p_Var5,0x18);
      p_Var5 = p_Var2;
    } while (p_Var2 != (_List_node_base *)&local_48);
  }
  return bVar6;
}

Assistant:

bool Find(const MP<_m, _O1>& polyRight, iterator& pos)
	{
		MP<_n, _O> poly(_order);
		pos = std::lower_bound(begin(), end(), poly = polyRight);
		return pos != end() && *pos == poly;
	}